

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O0

bool __thiscall Directory::create(Directory *this,int mode)

{
  bool bVar1;
  int iVar2;
  char *__path;
  string local_98;
  undefined1 local_78 [8];
  Directory parent_dir;
  int mode_local;
  Directory *this_local;
  
  parent_dir.super_File._84_4_ = mode;
  Path::parent_abi_cxx11_(&local_98,&(this->super_File).super_Path);
  Directory((Directory *)local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  bVar1 = Path::exists((Path *)&parent_dir);
  if ((bVar1) || (bVar1 = create((Directory *)local_78,parent_dir.super_File._84_4_), bVar1)) {
    __path = (char *)std::__cxx11::string::c_str();
    iVar2 = mkdir(__path,parent_dir.super_File._84_4_);
    this_local._7_1_ = iVar2 == 0;
  }
  else {
    this_local._7_1_ = false;
  }
  ~Directory((Directory *)local_78);
  return this_local._7_1_;
}

Assistant:

bool Directory::create (int mode /* = 0755 */)
{
  // No error handling because we want failure to be silent, somewhat emulating
  // "mkdir -p".
  Directory parent_dir = parent ();
  if (! parent_dir.exists ())
  {
      if (! parent_dir.create (mode))
      {
          return false;
      }
  }
  return mkdir (_data.c_str (), mode) == 0;
}